

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

TIntermSymbol * __thiscall
glslang::TIntermediate::addSymbol(TIntermediate *this,TType *type,TSourceLoc *loc)

{
  TIntermSymbol *pTVar1;
  pool_allocator<char> local_90;
  TString local_88;
  pool_allocator<char> local_60;
  TString local_58;
  undefined1 local_30 [8];
  TConstUnionArray unionArray;
  TSourceLoc *loc_local;
  TType *type_local;
  TIntermediate *this_local;
  
  unionArray.unionArray = (TConstUnionVector *)loc;
  TConstUnionArray::TConstUnionArray((TConstUnionArray *)local_30);
  pool_allocator<char>::pool_allocator(&local_60);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_58,""
             ,&local_60);
  pool_allocator<char>::pool_allocator(&local_90);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_88,""
             ,&local_90);
  pTVar1 = addSymbol(this,0,&local_58,&local_88,type,(TConstUnionArray *)local_30,
                     (TIntermTyped *)0x0,(TSourceLoc *)unionArray.unionArray);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_88);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_58);
  TConstUnionArray::~TConstUnionArray((TConstUnionArray *)local_30);
  return pTVar1;
}

Assistant:

TIntermSymbol* TIntermediate::addSymbol(const TType& type, const TSourceLoc& loc)
{
    TConstUnionArray unionArray;  // just a null constant

    return addSymbol(0, "", "", type, unionArray, nullptr, loc);
}